

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_add_filter_xz.c
# Opt level: O0

int archive_compressor_xz_close(archive_write_filter *f)

{
  private_data_conflict8 *data_00;
  int local_1c;
  int ret;
  private_data_conflict8 *data;
  archive_write_filter *f_local;
  
  data_00 = (private_data_conflict8 *)f->data;
  local_1c = drive_compressor(f,data_00,1);
  if (local_1c == 0) {
    data_00->total_out =
         (data_00->compressed_buffer_size - (data_00->stream).avail_out) + data_00->total_out;
    local_1c = __archive_write_filter
                         (f->next_filter,data_00->compressed,
                          data_00->compressed_buffer_size - (data_00->stream).avail_out);
    if ((f->code == 9) && (local_1c == 0)) {
      archive_le32enc(data_00->compressed,data_00->crc32);
      archive_le64enc(data_00->compressed + 4,data_00->total_in);
      archive_le64enc(data_00->compressed + 0xc,data_00->total_out + 0x14);
      local_1c = __archive_write_filter(f->next_filter,data_00->compressed,0x14);
    }
  }
  lzma_end(&data_00->stream);
  return local_1c;
}

Assistant:

static int
archive_compressor_xz_close(struct archive_write_filter *f)
{
	struct private_data *data = (struct private_data *)f->data;
	int ret;

	ret = drive_compressor(f, data, 1);
	if (ret == ARCHIVE_OK) {
		data->total_out +=
		    data->compressed_buffer_size - data->stream.avail_out;
		ret = __archive_write_filter(f->next_filter,
		    data->compressed,
		    data->compressed_buffer_size - data->stream.avail_out);
		if (f->code == ARCHIVE_FILTER_LZIP && ret == ARCHIVE_OK) {
			archive_le32enc(data->compressed, data->crc32);
			archive_le64enc(data->compressed+4, data->total_in);
			archive_le64enc(data->compressed+12, data->total_out + 20);
			ret = __archive_write_filter(f->next_filter,
			    data->compressed, 20);
		}
	}
	lzma_end(&(data->stream));
	return ret;
}